

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O1

class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
 __thiscall
pybind11::
bind_vector<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
          (pybind11 *this,handle scope,string *name)

{
  byte bVar1;
  type_info *ptVar2;
  is_new_style_constructor local_29;
  type_index local_28;
  undefined8 local_20;
  
  local_28._M_target = (type_info *)&ReadPath::typeinfo;
  ptVar2 = detail::get_type_info(&local_28,false);
  if (ptVar2 == (type_info *)0x0) {
    bVar1 = 1;
  }
  else {
    bVar1 = (byte)ptVar2->field_0x90 >> 3 & 1;
  }
  local_28._M_target._0_1_ = bVar1;
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  ::class_<pybind11::module_local>
            ((class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
              *)this,scope,(name->_M_dataplus)._M_p,(module_local *)&local_28);
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_bioinfologics[P]sdg_deps_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor>
            ((class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
              *)this,"__init__",(type *)&local_28,&local_29);
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_bioinfologics[P]sdg_deps_pybind11_detail_init_h:174:28),_pybind11::detail::is_new_style_constructor,_char[17]>
            ((class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
              *)this,"__init__",(type *)&local_28,&local_29,(char (*) [17])"Copy constructor");
  detail::
  vector_modifiers<std::vector<ReadPath,std::allocator<ReadPath>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>>
            ((enable_if_t<is_copy_constructible<typename_vector<ReadPath>::value_type>::value,_pybind11::class_<std::vector<ReadPath>,_std::unique_ptr<std::vector<ReadPath>_>_>_>
              *)this);
  detail::
  vector_accessor<std::vector<ReadPath,std::allocator<ReadPath>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>>
            ((enable_if_t<_vector_needs_copy<vector<ReadPath>_>::value,_pybind11::class_<std::vector<ReadPath>,_std::unique_ptr<std::vector<ReadPath>_>_>_>
              *)this);
  class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
  ::
  def<pybind11::bind_vector<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>(pybind11::handle,std::__cxx11::string_const&)::_lambda(std::vector<ReadPath,std::allocator<ReadPath>>const&)_1_,char[35]>
            ((class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
              *)this,"__bool__",(type *)&local_28,
             (char (*) [35])"Check whether the list is nonempty");
  local_28._M_target = (type_info *)std::vector<ReadPath,_std::allocator<ReadPath>_>::size;
  local_20 = 0;
  class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
  ::def<unsigned_long(std::vector<ReadPath,std::allocator<ReadPath>>::*)()const>
            ((class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
              *)this,"__len__",
             (offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *)&local_28);
  return (generic_type)(generic_type)this;
}

Assistant:

class_<Vector, holder_type> bind_vector(handle scope, std::string const &name, Args&&... args) {
    using Class_ = class_<Vector, holder_type>;

    // If the value_type is unregistered (e.g. a converting type) or is itself registered
    // module-local then make the vector binding module-local as well:
    using vtype = typename Vector::value_type;
    auto vtype_info = detail::get_type_info(typeid(vtype));
    bool local = !vtype_info || vtype_info->module_local;

    Class_ cl(scope, name.c_str(), pybind11::module_local(local), std::forward<Args>(args)...);

    // Declare the buffer interface if a buffer_protocol() is passed in
    detail::vector_buffer<Vector, Class_, Args...>(cl);

    cl.def(init<>());

    // Register copy constructor (if possible)
    detail::vector_if_copy_constructible<Vector, Class_>(cl);

    // Register comparison-related operators and functions (if possible)
    detail::vector_if_equal_operator<Vector, Class_>(cl);

    // Register stream insertion operator (if possible)
    detail::vector_if_insertion_operator<Vector, Class_>(cl, name);

    // Modifiers require copyable vector value type
    detail::vector_modifiers<Vector, Class_>(cl);

    // Accessor and iterator; return by value if copyable, otherwise we return by ref + keep-alive
    detail::vector_accessor<Vector, Class_>(cl);

    cl.def("__bool__",
        [](const Vector &v) -> bool {
            return !v.empty();
        },
        "Check whether the list is nonempty"
    );

    cl.def("__len__", &Vector::size);




#if 0
    // C++ style functions deprecated, leaving it here as an example
    cl.def(init<size_type>());

    cl.def("resize",
         (void (Vector::*) (size_type count)) & Vector::resize,
         "changes the number of elements stored");

    cl.def("erase",
        [](Vector &v, SizeType i) {
        if (i >= v.size())
            throw index_error();
        v.erase(v.begin() + i);
    }, "erases element at index ``i``");

    cl.def("empty",         &Vector::empty,         "checks whether the container is empty");
    cl.def("size",          &Vector::size,          "returns the number of elements");
    cl.def("push_back", (void (Vector::*)(const T&)) &Vector::push_back, "adds an element to the end");
    cl.def("pop_back",                               &Vector::pop_back, "removes the last element");

    cl.def("max_size",      &Vector::max_size,      "returns the maximum possible number of elements");
    cl.def("reserve",       &Vector::reserve,       "reserves storage");
    cl.def("capacity",      &Vector::capacity,      "returns the number of elements that can be held in currently allocated storage");
    cl.def("shrink_to_fit", &Vector::shrink_to_fit, "reduces memory usage by freeing unused memory");

    cl.def("clear", &Vector::clear, "clears the contents");
    cl.def("swap",   &Vector::swap, "swaps the contents");

    cl.def("front", [](Vector &v) {
        if (v.size()) return v.front();
        else throw index_error();
    }, "access the first element");

    cl.def("back", [](Vector &v) {
        if (v.size()) return v.back();
        else throw index_error();
    }, "access the last element ");

#endif

    return cl;
}